

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_settings.cpp
# Opt level: O0

shared_ptr<const_TestSettings> parse_settings(int param_1,char **argv)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  logic_error *this;
  pointer pbVar4;
  pointer in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_0000003c;
  shared_ptr<const_TestSettings> sVar5;
  undefined1 local_e0 [24];
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [48];
  pointer local_78;
  char **parameter;
  undefined1 local_68 [4];
  int integer;
  TestSettings results;
  char **argv_local;
  int param_0_local;
  
  results.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RDX;
  TestSettings::TestSettings((TestSettings *)local_68);
  parameter._4_4_ = 0;
  if ((*(long *)results.m_exclude.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) &&
     (pbVar4 = results.m_exclude.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 8,
     pbVar1 = results.m_exclude.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + 8,
     results.m_exclude.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar4, *(long *)pbVar1 != 0)) {
    while (local_78 = pbVar4, *(long *)local_78 != 0) {
      bVar2 = anon_unknown.dwarf_d704d8::append_string_list
                        (*(char **)local_78,"-only:",
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&results.m_allocator_stress_test);
      if (((!bVar2) &&
          (bVar2 = anon_unknown.dwarf_d704d8::append_string_list
                             (*(char **)local_78,"-exclude:",
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&results.m_run_only.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar2)) &&
         (iVar3 = __isoc99_sscanf(*(long *)local_78,"-rand_seed:%u",local_68), iVar3 != 1)) {
        iVar3 = __isoc99_sscanf(*(long *)local_78,"-exceptions:%d",(long)&parameter + 4);
        if (iVar3 == 1) {
          integer._0_1_ = parameter._4_4_ != 0;
        }
        else {
          iVar3 = __isoc99_sscanf(*(long *)local_78,"-spare_one_cpu:%d",(long)&parameter + 4);
          if (iVar3 == 1) {
            integer._1_1_ = parameter._4_4_ != 0;
          }
          else {
            iVar3 = __isoc99_sscanf(*(long *)local_78,"-print_progress:%d",(long)&parameter + 4);
            if (iVar3 == 1) {
              integer._3_1_ = parameter._4_4_ != 0;
            }
            else {
              iVar3 = __isoc99_sscanf(*(long *)local_78,"-test_allocators:%d",(long)&parameter + 4);
              if (iVar3 == 1) {
                integer._2_1_ = parameter._4_4_ != 0;
              }
              else {
                iVar3 = __isoc99_sscanf(*(long *)local_78,"-queue_tests_cardinality:%zu",&results);
                if (iVar3 != 1) {
                  local_e0[0x16] = 1;
                  this = (logic_error *)__cxa_allocate_exception(0x10);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_c8,"Unrecognized commandline: ",(allocator *)(local_e0 + 0x17));
                  std::operator+(local_a8,(char *)local_c8);
                  std::logic_error::logic_error(this,(string *)local_a8);
                  local_e0[0x16] = 0;
                  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                }
              }
            }
          }
        }
      }
      pbVar4 = local_78 + 8;
    }
  }
  std::make_shared<TestSettings,TestSettings&>((TestSettings *)local_e0);
  std::shared_ptr<TestSettings_const>::shared_ptr<TestSettings,void>
            ((shared_ptr<TestSettings_const> *)CONCAT44(in_register_0000003c,param_1),
             (shared_ptr<TestSettings> *)local_e0);
  std::shared_ptr<TestSettings>::~shared_ptr((shared_ptr<TestSettings> *)local_e0);
  TestSettings::~TestSettings((TestSettings *)local_68);
  sVar5.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar5.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CONCAT44(in_register_0000003c,param_1);
  return (shared_ptr<const_TestSettings>)
         sVar5.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const TestSettings> parse_settings(int /*argc*/, char ** argv)
{
    TestSettings results;

    int integer = 0;

    if (*argv != nullptr && *++argv != nullptr)
    {
        for (auto parameter = argv; *parameter != nullptr; parameter++)
        {
            if (append_string_list(*parameter, "-only:", results.m_run_only))
            {
            }
            else if (append_string_list(*parameter, "-exclude:", results.m_exclude))
            {
            }
            else if (sscanf(*parameter, "-rand_seed:%" SCNu32, &results.m_rand_seed) == 1)
            {
            }
            else if (sscanf(*parameter, "-exceptions:%d", &integer) == 1)
            {
                results.m_exceptions = integer != 0;
            }
            else if (sscanf(*parameter, "-spare_one_cpu:%d", &integer) == 1)
            {
                results.m_spare_one_cpu = integer != 0;
            }
            else if (sscanf(*parameter, "-print_progress:%d", &integer) == 1)
            {
                results.m_print_progress = integer != 0;
            }
            else if (sscanf(*parameter, "-test_allocators:%d", &integer) == 1)
            {
                results.m_test_allocators = integer != 0;
            }
            else if (
              sscanf(
                *parameter, "-queue_tests_cardinality:%zu", &results.m_queue_tests_cardinality) ==
              1)
            {
            }
            else
            {
                throw std::logic_error(std::string("Unrecognized commandline: ") + *parameter);
            }
        }
    }
    return std::make_shared<TestSettings>(results);
}